

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astUnexpandedSExpressionNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong array;
  sysbvm_tuple_t sVar1;
  bool bVar2;
  anon_struct_24_3_c3ddf0e2 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t sStack_60;
  sysbvm_tuple_t local_58;
  sysbvm_stackFrameRecord_t local_50;
  undefined8 local_40;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *puStack_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_68 = 0;
  sStack_60 = 0;
  local_58 = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 3;
  puStack_20 = (undefined1 *)&local_68;
  sysbvm_stackFrame_pushRecord(&local_38);
  local_50.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_50.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_40 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_50);
  array = *(ulong *)(*arguments + 0x28);
  bVar2 = (array & 0xf) != 0;
  if ((bVar2 || array == 0) || (*(uint *)(array + 0xc) < 8)) {
    sysbvm_stackFrame_popRecord(&local_50);
    sysbvm_stackFrame_popRecord(&local_38);
    sVar1 = sysbvm_array_create(context,0);
  }
  else {
    if (bVar2 || array == 0) {
      local_68 = 0;
    }
    else {
      local_68 = *(sysbvm_tuple_t *)(array + 0x10);
    }
    sStack_60 = sysbvm_array_fromOffset(context,array,1);
    local_58 = sysbvm_astUnexpandedApplicationNode_create
                         (context,*(sysbvm_tuple_t *)(*arguments + 0x10),local_68,sStack_60);
    sysbvm_stackFrame_popRecord(&local_50);
    sysbvm_stackFrame_popRecord(&local_38);
    sVar1 = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context,local_58,arguments[1]);
  }
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_astUnexpandedSExpressionNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astUnexpandedSExpressionNode_t **unexpandedSExpressionNode = (sysbvm_astUnexpandedSExpressionNode_t**)node;

    struct {
        sysbvm_tuple_t functionOrMacroExpression;
        sysbvm_tuple_t argumentExpressions;
        sysbvm_tuple_t unexpandedApplicationNode;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*unexpandedSExpressionNode)->super.sourcePosition);

    size_t elementCount = sysbvm_array_getSize((*unexpandedSExpressionNode)->elements);
    if(elementCount == 0)
    {
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_array_create(context, 0);
    }
    else
    {
        // Unexpanded application node.
        gcFrame.functionOrMacroExpression = sysbvm_array_at((*unexpandedSExpressionNode)->elements, 0);
        gcFrame.argumentExpressions = sysbvm_array_fromOffset(context, (*unexpandedSExpressionNode)->elements, 1);
        gcFrame.unexpandedApplicationNode = sysbvm_astUnexpandedApplicationNode_create(context, (*unexpandedSExpressionNode)->super.sourcePosition, gcFrame.functionOrMacroExpression, gcFrame.argumentExpressions);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.unexpandedApplicationNode, *environment);
    }
}